

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O3

void XPMP2::AIMultiInit(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  infoDataRefsTy *piVar8;
  iterator iVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  infoDataRefsTy drI;
  char buf [100];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  infoDataRefsTy local_1b8;
  multiDataRefsTy local_168;
  char local_98 [104];
  
  bVar10 = 0;
  drTcasOverride = XPLMFindDataRef("sim/operation/override/override_TCAS");
  drMapOverride = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");
  numSlots = 0;
  drTcasModeS = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
  if (drTcasModeS != 0) {
    uVar3 = XPLMGetDatavi(drTcasModeS,0,0,0);
    if (uVar3 < 2) {
      drTcasModeS = 0;
      numSlots = 0;
    }
    else {
      numSlots = (long)(int)uVar3 - 1;
      drTcasModeC = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
      drTcasFlightId = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
      drTcasIcaoType = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
      drTcasX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
      drTcasY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
      drTcasZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
      drTcasVX = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
      drTcasVY = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
      drTcasVZ = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
      drTcasVertSpeed = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
      drTcasHeading = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
      drTcasPitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
      drTcasRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
      drTcasGrnd = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
      drTcasGear = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
      drTcasFlap = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
      drTcasFlap2 = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
      drTcasSpeedbrake = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
      drTcasSlat = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
      drTcasWingSweep = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
      drTcasThrottle = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
      drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");
      if (drTcasYokePitch == 0) {
        drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");
      }
      drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
      if (drTcasYokeRoll == 0) {
        drTcasYokeRoll = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
      }
      drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
      if (drTcasYokeYaw == 0) {
        drTcasYokeYaw = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
      }
      drTcasLights = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
      drTcasWakeWingSpan = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
      drTcasWakeWingArea = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
      drTcasWakeCat = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
      drTcasWakeMass = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
      drTcasWakeAoA = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
      drTcasWakeLift = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
    }
  }
  if (DAT_002eb988._M_current != gMultiRef) {
    DAT_002eb988._M_current = gMultiRef;
  }
  iVar2._M_current = DAT_002eb988._M_current;
  memset(&local_168,0,200);
  if (iVar2._M_current == DAT_002eb990) {
    std::vector<XPMP2::multiDataRefsTy,std::allocator<XPMP2::multiDataRefsTy>>::
    _M_realloc_insert<XPMP2::multiDataRefsTy_const&>
              ((vector<XPMP2::multiDataRefsTy,std::allocator<XPMP2::multiDataRefsTy>> *)&gMultiRef,
               iVar2,&local_168);
  }
  else {
    memset(iVar2._M_current,0,200);
    DAT_002eb988._M_current = iVar2._M_current + 1;
  }
  local_168.taxiLights = (XPLMDataRef)0x0;
  local_168.yoke_pitch = (XPLMDataRef)0x0;
  local_168.X = (XPLMDataRef)0x0;
  local_168.Y = (XPLMDataRef)0x0;
  local_168.Z = (XPLMDataRef)0x0;
  local_168.pitch = (XPLMDataRef)0x0;
  local_168.roll = (XPLMDataRef)0x0;
  local_168.heading = (XPLMDataRef)0x0;
  uVar7 = 1;
  snprintf(local_98,100,"sim/multiplayer/position/plane%u_x",1);
  local_168.X = (XPLMDataRef)XPLMFindDataRef(local_98);
  if (local_168.X != (XPLMDataRef)0x0) {
    do {
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_y",uVar7);
      local_168.Y = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_z",uVar7);
      local_168.Z = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_v_x",uVar7);
      local_168.v_x = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_v_y",uVar7);
      local_168.v_y = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_v_z",uVar7);
      local_168.v_z = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_the",uVar7);
      local_168.pitch = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_phi",uVar7);
      local_168.roll = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_psi",uVar7);
      local_168.heading = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_gear_deploy",uVar7);
      local_168.gear = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_flap_ratio",uVar7);
      local_168.flap = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_flap_ratio2",uVar7);
      local_168.flap2 = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_spoiler_ratio",uVar7);
      local_168.spoiler = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_speedbrake_ratio",uVar7);
      local_168.speedbrake = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_slat_ratio",uVar7);
      local_168.slat = (XPLMDataRef)XPLMFindDataRef(local_98);
      if (local_168.slat == (XPLMDataRef)0x0) {
        snprintf(local_98,100,"sim/multiplayer/position/plane%u_sla1_ratio",uVar7);
        local_168.slat = (XPLMDataRef)XPLMFindDataRef(local_98);
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_wing_sweep",uVar7);
      local_168.wingSweep = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_throttle",uVar7);
      local_168.throttle = (XPLMDataRef)XPLMFindDataRef(local_98);
      if (numSlots == 0) {
        snprintf(local_98,100,"sim/multiplayer/position/plane%u_yolk_pitch",uVar7);
        local_168.yoke_pitch = (XPLMDataRef)XPLMFindDataRef(local_98);
        snprintf(local_98,100,"sim/multiplayer/position/plane%u_yolk_roll",uVar7);
        local_168.yoke_roll = (XPLMDataRef)XPLMFindDataRef(local_98);
        snprintf(local_98,100,"sim/multiplayer/position/plane%u_yolk_yaw",uVar7);
        local_168.yoke_yaw = (XPLMDataRef)XPLMFindDataRef(local_98);
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_beacon_lights_on",uVar7);
      local_168.bcnLights = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_landing_lights_on",uVar7);
      local_168.landLights = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_nav_lights_on",uVar7);
      local_168.navLights = (XPLMDataRef)XPLMFindDataRef(local_98);
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_strobe_lights_on",uVar7);
      local_168.strbLights = (XPLMDataRef)XPLMFindDataRef(local_98);
      iVar5 = (int)uVar7;
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_taxi_light_on");
      local_168.taxiLights = (XPLMDataRef)XPLMFindDataRef(local_98);
      iVar2._M_current = DAT_002eb988._M_current;
      auVar11._0_4_ = -(uint)((int)local_168.X == 0 && local_168.X._4_4_ == 0);
      auVar11._4_4_ = -(uint)((int)local_168.Y == 0 && local_168.Y._4_4_ == 0);
      auVar11._8_4_ = -(uint)((int)local_168.Z == 0 && (int)((ulong)local_168.Z >> 0x20) == 0);
      auVar11._12_4_ =
           -(uint)((int)local_168.pitch == 0 && (int)((ulong)local_168.pitch >> 0x20) == 0);
      iVar5 = movmskps(iVar5,auVar11);
      if ((((iVar5 != 0) || (local_168.roll == (XPLMDataRef)0x0)) ||
          (local_168.heading == (XPLMDataRef)0x0)) || (local_168.taxiLights == (XPLMDataRef)0x0))
      break;
      if (DAT_002eb988._M_current == DAT_002eb990) {
        std::vector<XPMP2::multiDataRefsTy,std::allocator<XPMP2::multiDataRefsTy>>::
        _M_realloc_insert<XPMP2::multiDataRefsTy_const&>
                  ((vector<XPMP2::multiDataRefsTy,std::allocator<XPMP2::multiDataRefsTy>> *)
                   &gMultiRef,DAT_002eb988,&local_168);
      }
      else {
        memcpy(DAT_002eb988._M_current,&local_168,200);
        DAT_002eb988._M_current = iVar2._M_current + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      local_168.taxiLights = (XPLMDataRef)0x0;
      local_168.yoke_pitch = (XPLMDataRef)0x0;
      local_168.X = (XPLMDataRef)0x0;
      local_168.Y = (XPLMDataRef)0x0;
      local_168.Z = (XPLMDataRef)0x0;
      local_168.heading = (XPLMDataRef)0x0;
      local_168.pitch = (XPLMDataRef)0x0;
      local_168.roll = (XPLMDataRef)0x0;
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_x",uVar7);
      local_168.X = (XPLMDataRef)XPLMFindDataRef(local_98);
    } while (local_168.X != (XPLMDataRef)0x0);
  }
  if (numSlots == 0) {
    numSlots = ((long)DAT_002eb988._M_current - (long)gMultiRef >> 3) * -0x70a3d70a3d70a3d7 - 1;
  }
  uVar7 = numSlots;
  if (DAT_002eb9a0._M_current != gInfoRef) {
    DAT_002eb9a0._M_current = gInfoRef;
  }
  local_1b8.infoAptTo = (XPLMDataRef)0x0;
  local_1b8.cslModel = (XPLMDataRef)0x0;
  local_1b8.infoFlightNum = (XPLMDataRef)0x0;
  local_1b8.infoAptFrom = (XPLMDataRef)0x0;
  local_1b8.infoIcaoAirline = (XPLMDataRef)0x0;
  local_1b8.infoAirline = (XPLMDataRef)0x0;
  local_1b8.infoManufacturer = (XPLMDataRef)0x0;
  local_1b8.infoModel = (XPLMDataRef)0x0;
  local_1b8.infoTailNum = (XPLMDataRef)0x0;
  local_1b8.infoIcaoAcType = (XPLMDataRef)0x0;
  if (DAT_002eb9a0._M_current == DAT_002eb9a8) {
    std::vector<XPMP2::infoDataRefsTy,std::allocator<XPMP2::infoDataRefsTy>>::
    _M_realloc_insert<XPMP2::infoDataRefsTy_const&>
              ((vector<XPMP2::infoDataRefsTy,std::allocator<XPMP2::infoDataRefsTy>> *)&gInfoRef,
               DAT_002eb9a0,&local_1b8);
    uVar7 = numSlots;
  }
  else {
    (DAT_002eb9a0._M_current)->infoAptTo = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->cslModel = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoFlightNum = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoAptFrom = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoIcaoAirline = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoAirline = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoManufacturer = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoModel = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoTailNum = (XPLMDataRef)0x0;
    (DAT_002eb9a0._M_current)->infoIcaoAcType = (XPLMDataRef)0x0;
    DAT_002eb9a0._M_current = DAT_002eb9a0._M_current + 1;
  }
  if (uVar7 != 0) {
    paVar1 = &local_1d8.field_2;
    uVar7 = 1;
    do {
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_tailnum",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoTailNum = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoTailNum = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_ICAO",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoIcaoAcType = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoIcaoAcType = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_manufacturer",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoManufacturer = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoManufacturer = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_model",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoModel = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoModel = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_ICAOairline",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoIcaoAirline = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoIcaoAirline = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_airline",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoAirline = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoAirline = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_flightnum",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoFlightNum = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoFlightNum = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_apt_from",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoAptFrom = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoAptFrom = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_apt_to",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.infoAptTo = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.infoAptTo = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      snprintf(local_98,100,"sim/multiplayer/position/plane%u_cslModel",uVar7);
      iVar5 = XPLMShareData(local_98,0x20,0,0);
      if (iVar5 == 0) {
        local_1b8.cslModel = (XPLMDataRef)0x0;
      }
      else {
        local_1b8.cslModel = (XPLMDataRef)XPLMFindDataRef(local_98);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,local_98,local_98 + sVar4);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &vecDREdataRefStr_abi_cxx11_,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      if (DAT_002eb9a0._M_current == DAT_002eb9a8) {
        std::vector<XPMP2::infoDataRefsTy,std::allocator<XPMP2::infoDataRefsTy>>::
        _M_realloc_insert<XPMP2::infoDataRefsTy_const&>
                  ((vector<XPMP2::infoDataRefsTy,std::allocator<XPMP2::infoDataRefsTy>> *)&gInfoRef,
                   DAT_002eb9a0,&local_1b8);
      }
      else {
        piVar8 = &local_1b8;
        iVar9._M_current = DAT_002eb9a0._M_current;
        for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
          (iVar9._M_current)->infoTailNum = piVar8->infoTailNum;
          piVar8 = (infoDataRefsTy *)((long)piVar8 + (ulong)bVar10 * -0x10 + 8);
          iVar9._M_current = iVar9._M_current + (ulong)bVar10 * -0x10 + 8;
        }
        DAT_002eb9a0._M_current = DAT_002eb9a0._M_current + 1;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 <= numSlots);
  }
  return;
}

Assistant:

void AIMultiInit ()
{
    // *** TCAS Target dataRefs ***
    
    // Many of these will only be available with X-Plane 11.50b8 or later
    drTcasOverride      = XPLMFindDataRef("sim/operation/override/override_TCAS");
    drMapOverride       = XPLMFindDataRef("sim/operation/override/override_multiplayer_map_layer");

    // This is probably the most important one, serving as a key,
    // but for us also as an indicator if we are in the right XP version
    // to use TCAS Override
    numSlots = 0;
    drTcasModeS         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeS_id");
    if (GoTCASOverride())                   // we can use TCAS Override
    {
        // Let's establish array size (we shall not assume it is 64, though initially it is)
        numSlots = (size_t)XPLMGetDatavi(drTcasModeS, nullptr, 0, 0);
        if (numSlots >= 2) {                // expected is 64...just a safety check
            // Reduce by one: The user plane is off limits
            numSlots--;
            
            // Now fetch all the other dataRefs...they should work
            drTcasModeC         = XPLMFindDataRef("sim/cockpit2/tcas/targets/modeC_code");
            drTcasFlightId      = XPLMFindDataRef("sim/cockpit2/tcas/targets/flight_id");
            drTcasIcaoType      = XPLMFindDataRef("sim/cockpit2/tcas/targets/icao_type");
            drTcasX             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/x");
            drTcasY             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/y");
            drTcasZ             = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/z");
            drTcasVX            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vx");
            drTcasVY            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vy");
            drTcasVZ            = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vz");
            drTcasVertSpeed     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/vertical_speed");
            drTcasHeading       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/psi");
            drTcasPitch         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/the");
            drTcasRoll          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/phi");
            drTcasGrnd          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/weight_on_wheels");
            drTcasGear          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/gear_deploy");
            drTcasFlap          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio");
            drTcasFlap2         = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/flap_ratio2");
            drTcasSpeedbrake    = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/speedbrake_ratio");
            drTcasSlat          = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/slat_ratio");
            drTcasWingSweep     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/wing_sweep");
            drTcasThrottle      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/throttle");
            drTcasYokePitch     = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_pitch");     // XP12 silently corrected the spelling
            if (!drTcasYokePitch)
                drTcasYokePitch = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_pitch");     // XP11 had copied the original spelling mistake
            drTcasYokeRoll      = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_roll");
            if (!drTcasYokeRoll)
                drTcasYokeRoll  = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_roll");
            drTcasYokeYaw       = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yoke_yaw");
            if (!drTcasYokeYaw)
                drTcasYokeYaw   = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/yolk_yaw");
            drTcasLights        = XPLMFindDataRef("sim/cockpit2/tcas/targets/position/lights");
            // Wake support as of XP12, so these can fail in earlier versions:
            drTcasWakeWingSpan  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_span_m");
            drTcasWakeWingArea  = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wing_area_m2");
            drTcasWakeCat       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/wake_cat");
            drTcasWakeMass      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/mass_kg");
            drTcasWakeAoA       = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/aoa");
            drTcasWakeLift      = XPLMFindDataRef("sim/cockpit2/tcas/targets/wake/lift_N");
        } else {
            // not expected to happen, but safety measure: fallback to classic TCAS
            drTcasModeS = nullptr;
            numSlots = 0;
        }
    }
    
    // *** Legacy Multiplayer DataRefs ***
    
    // We need them only for proper initialization at the beginning
    // and when not filling all (19) slots
    char        buf[100];
    gMultiRef.clear();                      // just a safety measure against multi init
    multiDataRefsTy drM;                    // one set of dataRefs for one plane
    gMultiRef.push_back(drM);               // add an empty record at position 0 (user's plane)

    // Code for finding a standard X-Plane dataRef
#define FIND_PLANE_DR(membVar, dataRefTxt, PlaneNr)                         \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);    \
    drM.membVar = XPLMFindDataRef(buf);

    // We don't know how many multiplayer planes there are - fetch as many as we can.
    // Loop over all possible AI/multiplayer slots
    for (unsigned nDrM = 1; true; nDrM++)
    {
        drM.clear();
        // position
        FIND_PLANE_DR(X,                    "x",                    nDrM);
        if (!drM.X) break;
        FIND_PLANE_DR(Y,                    "y",                    nDrM);
        FIND_PLANE_DR(Z,                    "z",                    nDrM);
        // cartesian velocities
        FIND_PLANE_DR(v_x,                  "v_x",                  nDrM);
        FIND_PLANE_DR(v_y,                  "v_y",                  nDrM);
        FIND_PLANE_DR(v_z,                  "v_z",                  nDrM);
        // attitude
        FIND_PLANE_DR(pitch,                "the",                  nDrM);
        FIND_PLANE_DR(roll,                 "phi",                  nDrM);
        FIND_PLANE_DR(heading,              "psi",                  nDrM);
        // configuration
        FIND_PLANE_DR(gear,                 "gear_deploy",          nDrM);
        FIND_PLANE_DR(flap,                 "flap_ratio",           nDrM);
        FIND_PLANE_DR(flap2,                "flap_ratio2",          nDrM);
        FIND_PLANE_DR(spoiler,              "spoiler_ratio",        nDrM);
        FIND_PLANE_DR(speedbrake,           "speedbrake_ratio",     nDrM);
        FIND_PLANE_DR(slat,                 "slat_ratio",           nDrM); // _should_ expect this name
        if (!drM.slat) {
            FIND_PLANE_DR(slat,             "sla1_ratio",           nDrM); // but in reality it is this
        }
        FIND_PLANE_DR(wingSweep,            "wing_sweep",           nDrM);
        FIND_PLANE_DR(throttle,             "throttle",             nDrM);
        
        // In XP12 the following classic dataRefs are considered legacy and throw user-visible warnings if used
        // I'm too lazy to use the (proper) array sim/multiplayer/controls/yoke_pitch_ratio[20] instead
        // due to that being an array dataRefs as opposed to these here using plane%u semantics.
        // But in XP12 we don't need the legacy dataRefs anyway, so we can live without these 3 if we have TCAS override:
        if (!numSlots) {
            FIND_PLANE_DR(yoke_pitch,       "yolk_pitch",           nDrM);
            FIND_PLANE_DR(yoke_roll,        "yolk_roll",            nDrM);
            FIND_PLANE_DR(yoke_yaw,         "yolk_yaw",             nDrM);
        }
        
        // lights
        FIND_PLANE_DR(bcnLights,            "beacon_lights_on",     nDrM);
        FIND_PLANE_DR(landLights,           "landing_lights_on",    nDrM);
        FIND_PLANE_DR(navLights,            "nav_lights_on",        nDrM);
        FIND_PLANE_DR(strbLights,           "strobe_lights_on",     nDrM);
        FIND_PLANE_DR(taxiLights,           "taxi_light_on",        nDrM);
        if (!drM) break;                    // break out of loop once the slot doesn't exist
        gMultiRef.push_back(drM);
    }
    
    // If using TCAS fallback with multiplayer dataRefs
    // then we set the number of slots based on available multiplayer slots
    if (!numSlots)
        numSlots = gMultiRef.size()-1;
    
    // *** Shared dataRefs for providing additional text info ***
    
    // While these had been defined to be 19 only,
    // we extend it to as many as there are TCAS targets
    gInfoRef.clear();
    infoDataRefsTy  drI;            // one set of dataRefs for one plane
    gInfoRef.push_back(drI);        // add an empty record at position 0 (user's plane)

    // Code for finding a non-standard shared dataRef for text information sharing
#define SHARE_PLANE_DR(membVar, dataRefTxt, PlaneNr)                                    \
    snprintf(buf,sizeof(buf),"sim/multiplayer/position/plane%u_" dataRefTxt,PlaneNr);   \
    if (XPLMShareData(buf, xplmType_Data, NULL, NULL)) {                                \
        drI.membVar = XPLMFindDataRef(buf);                                             \
        vecDREdataRefStr.push_back(buf);                                                \
    }                                                                                   \
    else drI.membVar = NULL;
    
    // We add as many shared info dataRefs as there are TCAS targets (probably 63)
    // or alternatively standard multiplayer dataRefs
    for (unsigned n = 1; n <= numSlots; n++)
    {
        // Shared data for providing textual info (see XPMPInfoTexts_t)
        SHARE_PLANE_DR(infoTailNum,         "tailnum",              n);
        SHARE_PLANE_DR(infoIcaoAcType,      "ICAO",                 n);
        SHARE_PLANE_DR(infoManufacturer,    "manufacturer",         n);
        SHARE_PLANE_DR(infoModel,           "model",                n);
        SHARE_PLANE_DR(infoIcaoAirline,     "ICAOairline",          n);
        SHARE_PLANE_DR(infoAirline,         "airline",              n);
        SHARE_PLANE_DR(infoFlightNum,       "flightnum",            n);
        SHARE_PLANE_DR(infoAptFrom,         "apt_from",             n);
        SHARE_PLANE_DR(infoAptTo,           "apt_to",               n);
        SHARE_PLANE_DR(cslModel,            "cslModel",             n);
        gInfoRef.push_back(drI);
    }
}